

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O1

void google::protobuf::compiler::cpp::ListAllTypesForServices
               (FileDescriptor *fd,
               vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
               *types)

{
  ServiceDescriptor *this;
  int index;
  int index_00;
  Descriptor *local_40;
  FileDescriptor *local_38;
  
  if (0 < *(int *)(fd + 0x44)) {
    index = 0;
    local_38 = fd;
    do {
      this = FileDescriptor::service(local_38,index);
      if (0 < *(int *)(this + 0x38)) {
        index_00 = 0;
        do {
          ServiceDescriptor::method(this,index_00);
          local_40 = (Descriptor *)google::protobuf::MethodDescriptor::input_type();
          std::
          vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
          ::emplace_back<google::protobuf::Descriptor_const*>
                    ((vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
                      *)types,&local_40);
          local_40 = (Descriptor *)google::protobuf::MethodDescriptor::output_type();
          std::
          vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
          ::emplace_back<google::protobuf::Descriptor_const*>
                    ((vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
                      *)types,&local_40);
          index_00 = index_00 + 1;
        } while (index_00 < *(int *)(this + 0x38));
      }
      index = index + 1;
    } while (index < *(int *)(local_38 + 0x44));
  }
  return;
}

Assistant:

void ListAllTypesForServices(const FileDescriptor* fd,
                             std::vector<const Descriptor*>* types) {
  for (int i = 0; i < fd->service_count(); i++) {
    const ServiceDescriptor* sd = fd->service(i);
    for (int j = 0; j < sd->method_count(); j++) {
      const MethodDescriptor* method = sd->method(j);
      types->push_back(method->input_type());
      types->push_back(method->output_type());
    }
  }
}